

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::prepare(SurfaceMesh *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long *plVar1;
  ShaderProgram *in_stack_00000118;
  SurfaceMesh *in_stack_00000120;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffffe88;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe90;
  SurfaceMesh *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  string *local_118;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string *local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *initRules;
  SurfaceMesh *this_00;
  string *in_stack_ffffffffffffff80;
  ShaderProgram *in_stack_ffffffffffffff88;
  Engine *in_stack_ffffffffffffff90;
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"MESH",&local_39);
  local_ba = 1;
  local_b8 = (string *)&local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"SHADE_BASECOLOR",&local_b9);
  local_ba = 0;
  initRules = &local_b0;
  this_00 = (SurfaceMesh *)0x1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3a5121);
  __l._M_len = in_stack_fffffffffffffed0;
  __l._M_array = in_stack_fffffffffffffec8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  addStructureRules(this_00,initRules);
  (**(code **)(*plVar1 + 0x118))(local_18,plVar1,local_38,local_68,0);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x3a51be);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3a51e5);
  local_118 = (string *)&stack0xffffffffffffff70;
  do {
    local_118 = local_118 + -0x20;
    std::__cxx11::string::~string(local_118);
  } while (local_118 != (string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe90);
  fillGeometryBuffers(in_stack_00000120,in_stack_00000118);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe90);
  getMaterial_abi_cxx11_(in_stack_fffffffffffffe98);
  render::Engine::setMaterial
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void SurfaceMesh::prepare() {
  program = render::engine->requestShader("MESH", addStructureRules({"SHADE_BASECOLOR"}));

  // Populate draw buffers
  fillGeometryBuffers(*program);
  render::engine->setMaterial(*program, getMaterial());
}